

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

void kratos::remove_unused_vars(Generator *top)

{
  undefined1 local_80 [8];
  VarUnusedVisitor visitor;
  Generator *top_local;
  
  visitor.error_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)top;
  VarUnusedVisitor::VarUnusedVisitor((VarUnusedVisitor *)local_80);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_80,
             (Generator *)visitor.error_mutex_.super___mutex_base._M_mutex.__data.__list.__next);
  VarUnusedVisitor::~VarUnusedVisitor((VarUnusedVisitor *)local_80);
  return;
}

Assistant:

void remove_unused_vars(Generator* top) {
    VarUnusedVisitor visitor;
    visitor.visit_generator_root_p(top);
}